

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkset_avx512.c
# Opt level: O0

uint8_t * CHUNKCOPY(uint8_t *out,uint8_t *from,uint len)

{
  byte bVar1;
  uint len_00;
  mask_t mVar2;
  uint in_EDX;
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  undefined1 auVar5 [32];
  mask_t rem_mask;
  uint32_t rem;
  chunk_t_conflict chunk;
  chunk_t_conflict *in_stack_fffffffffffffee8;
  uint8_t *out_00;
  uint8_t *out_01;
  longlong local_100 [2];
  longlong lStack_f0;
  longlong lStack_e8;
  uint local_cc;
  undefined1 (*local_c8) [32];
  undefined1 (*local_c0) [32];
  uint8_t *local_b8;
  undefined1 auVar3 [16];
  undefined1 auVar4 [24];
  undefined1 auVar6 [32];
  
  len_00 = in_EDX & 0x1f;
  local_c8 = in_RSI;
  local_c0 = in_RDI;
  if (in_EDX < 0x20) {
    mVar2 = gen_mask(len_00);
    auVar5 = vmovdqu8_avx512vl(*local_c8);
    auVar3[1] = ((byte)(mVar2 >> 1) & 1) * auVar5[1];
    auVar3[0] = ((byte)mVar2 & 1) * auVar5[0];
    auVar3[2] = ((byte)(mVar2 >> 2) & 1) * auVar5[2];
    auVar3[3] = ((byte)(mVar2 >> 3) & 1) * auVar5[3];
    auVar3[4] = ((byte)(mVar2 >> 4) & 1) * auVar5[4];
    auVar3[5] = ((byte)(mVar2 >> 5) & 1) * auVar5[5];
    auVar3[6] = ((byte)(mVar2 >> 6) & 1) * auVar5[6];
    auVar3[7] = ((byte)(mVar2 >> 7) & 1) * auVar5[7];
    auVar3[8] = ((byte)(mVar2 >> 8) & 1) * auVar5[8];
    auVar3[9] = ((byte)(mVar2 >> 9) & 1) * auVar5[9];
    auVar3[10] = ((byte)(mVar2 >> 10) & 1) * auVar5[10];
    auVar3[0xb] = ((byte)(mVar2 >> 0xb) & 1) * auVar5[0xb];
    auVar3[0xc] = ((byte)(mVar2 >> 0xc) & 1) * auVar5[0xc];
    auVar3[0xd] = ((byte)(mVar2 >> 0xd) & 1) * auVar5[0xd];
    auVar3[0xe] = ((byte)(mVar2 >> 0xe) & 1) * auVar5[0xe];
    auVar3[0xf] = ((byte)(mVar2 >> 0xf) & 1) * auVar5[0xf];
    auVar4[0x10] = ((byte)(mVar2 >> 0x10) & 1) * auVar5[0x10];
    auVar4._0_16_ = auVar3;
    auVar4[0x11] = ((byte)(mVar2 >> 0x11) & 1) * auVar5[0x11];
    auVar4[0x12] = ((byte)(mVar2 >> 0x12) & 1) * auVar5[0x12];
    auVar4[0x13] = ((byte)(mVar2 >> 0x13) & 1) * auVar5[0x13];
    auVar4[0x14] = ((byte)(mVar2 >> 0x14) & 1) * auVar5[0x14];
    auVar4[0x15] = ((byte)(mVar2 >> 0x15) & 1) * auVar5[0x15];
    auVar4[0x16] = ((byte)(mVar2 >> 0x16) & 1) * auVar5[0x16];
    auVar4[0x17] = ((byte)(mVar2 >> 0x17) & 1) * auVar5[0x17];
    bVar1 = (byte)(mVar2 >> 0x18);
    auVar6[0x18] = (bVar1 & 1) * auVar5[0x18];
    auVar6._0_24_ = auVar4;
    auVar6[0x19] = (bVar1 >> 1 & 1) * auVar5[0x19];
    auVar6[0x1a] = (bVar1 >> 2 & 1) * auVar5[0x1a];
    auVar6[0x1b] = (bVar1 >> 3 & 1) * auVar5[0x1b];
    auVar6[0x1c] = (bVar1 >> 4 & 1) * auVar5[0x1c];
    auVar6._30_2_ = auVar5._30_2_;
    auVar6[0x1d] = (bVar1 >> 5 & 1) * auVar5[0x1d];
    lStack_f0 = auVar4._16_8_;
    lStack_e8 = auVar6._24_8_;
    auVar5._16_8_ = lStack_f0;
    auVar5._0_16_ = auVar3;
    auVar5._24_8_ = lStack_e8;
    auVar5 = vmovdqu8_avx512vl(auVar5);
    *local_c0 = auVar5;
    local_b8 = *local_c0 + len_00;
  }
  else {
    local_cc = in_EDX;
    loadchunk((uint8_t *)in_RSI,(chunk_t_conflict *)local_100);
    if (len_00 == 0) {
      out_00 = (uint8_t *)0x20;
    }
    else {
      out_00 = (uint8_t *)(ulong)len_00;
    }
    out_01 = out_00;
    storechunk(out_00,in_stack_fffffffffffffee8);
    local_c0 = (undefined1 (*) [32])(out_00 + (long)*local_c0);
    local_c8 = (undefined1 (*) [32])(out_00 + (long)*local_c8);
    for (local_cc = local_cc - (int)out_00; local_cc != 0; local_cc = local_cc + -0x20) {
      loadchunk((uint8_t *)local_c8,(chunk_t_conflict *)local_100);
      storechunk(out_01,in_stack_fffffffffffffee8);
      local_c0 = (undefined1 (*) [32])((long)local_c0 + 0x20);
      local_c8 = (undefined1 (*) [32])((long)local_c8 + 0x20);
    }
    local_b8 = (uint8_t *)local_c0;
  }
  return local_b8;
}

Assistant:

static inline uint8_t* CHUNKCOPY(uint8_t *out, uint8_t const *from, unsigned len) {
    Assert(len > 0, "chunkcopy should never have a length 0");

    chunk_t chunk;
    uint32_t rem = len % sizeof(chunk_t);

    if (len < sizeof(chunk_t)) {
        mask_t rem_mask = gen_mask(rem);
        chunk = _mm256_maskz_loadu_epi8(rem_mask, from);
        _mm256_mask_storeu_epi8(out, rem_mask, chunk);
        return out + rem;
    }

    loadchunk(from, &chunk);
    rem = (rem == 0) ? sizeof(chunk_t) : rem;
    storechunk(out, &chunk);
    out += rem;
    from += rem;
    len -= rem;

    while (len > 0) {
        loadchunk(from, &chunk);
        storechunk(out, &chunk);
        out += sizeof(chunk_t);
        from += sizeof(chunk_t);
        len -= sizeof(chunk_t);
    }

    return out;
}